

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall
          (Flow *__return_storage_ptr__,
          ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *this,Call *curr)

{
  Name breakTo;
  bool bVar1;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  Expression **ppEVar4;
  mapped_type *this_00;
  undefined1 local_128 [8];
  Flow retFlow;
  undefined1 local_d0 [8];
  Flow argFlow;
  undefined1 local_80 [4];
  Index i;
  unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
  prevLocalValues;
  size_t numOperands;
  size_t local_38;
  char *local_30;
  Function *local_28;
  Function *func;
  Call *curr_local;
  ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  
  func = (Function *)curr;
  curr_local = (Call *)this;
  this_local = (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)
               __return_storage_ptr__;
  if (((*(uint *)&(this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>).field_0x1c & 2)
       != 0) &&
     ((this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>).module != (Module *)0x0)) {
    local_38 = (curr->target).super_IString.str._M_len;
    local_30 = (curr->target).super_IString.str._M_str;
    local_28 = Module::getFunction((this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>
                                   ).module,(Name)(curr->target).super_IString.str);
    bVar1 = Importable::imported(&local_28->super_Importable);
    if (!bVar1) {
      numOperands = (size_t)Function::getResults(local_28);
      bVar1 = wasm::Type::isConcrete((Type *)&numOperands);
      if (bVar1) {
        p_Var2 = (__node_base_ptr)
                 ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            &(func->super_Importable).super_Named.hasExplicitName);
        prevLocalValues._M_h._M_single_bucket = p_Var2;
        p_Var3 = (__node_base_ptr)Function::getNumParams(local_28);
        if (p_Var2 != p_Var3) {
          __assert_fail("numOperands == func->getNumParams()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x85e,
                        "Flow wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall(Call *) [SubType = wasm::PrecomputingExpressionRunner]"
                       );
        }
        std::
        unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
        ::unordered_map((unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
                         *)local_80,&this->localValues);
        std::
        unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
        ::clear(&this->localValues);
        for (argFlow.breakTo.super_IString.str._M_str._4_4_ = 0;
            (__node_base_ptr)(ulong)argFlow.breakTo.super_IString.str._M_str._4_4_ <
            prevLocalValues._M_h._M_single_bucket;
            argFlow.breakTo.super_IString.str._M_str._4_4_ =
                 argFlow.breakTo.super_IString.str._M_str._4_4_ + 1) {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)&(func->super_Importable).super_Named.hasExplicitName,
                               (ulong)argFlow.breakTo.super_IString.str._M_str._4_4_);
          ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
                    ((Flow *)local_d0,
                     &this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>,*ppEVar4);
          bVar1 = Flow::breaking((Flow *)local_d0);
          if (!bVar1) {
            bVar1 = Literals::isConcrete((Literals *)local_d0);
            if (!bVar1) {
              __assert_fail("argFlow.values.isConcrete()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                            ,0x864,
                            "Flow wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall(Call *) [SubType = wasm::PrecomputingExpressionRunner]"
                           );
            }
            this_00 = std::
                      unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
                      ::operator[](&this->localValues,
                                   (key_type *)((long)&argFlow.breakTo.super_IString.str._M_str + 4)
                                  );
            Literals::operator=(this_00,(Literals *)local_d0);
          }
          Flow::~Flow((Flow *)local_d0);
        }
        ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
                  ((Flow *)local_128,
                   &this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>,local_28->body)
        ;
        std::
        unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
        ::operator=(&this->localValues,
                    (unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
                     *)local_80);
        bVar1 = IString::operator==((IString *)
                                    ((long)&retFlow.values.super_SmallVector<wasm::Literal,_1UL>.
                                            flexible.
                                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                            ._M_impl.super__Vector_impl_data + 0x10),
                                    (IString *)RETURN_FLOW);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__,(Literals *)local_128);
          bVar1 = true;
        }
        else {
          bVar1 = Flow::breaking((Flow *)local_128);
          if (bVar1) {
            bVar1 = false;
          }
          else {
            Flow::Flow(__return_storage_ptr__,(Flow *)local_128);
            bVar1 = true;
          }
        }
        Flow::~Flow((Flow *)local_128);
        std::
        unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
                          *)local_80);
        if (bVar1) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  breakTo.super_IString.str._M_str = DAT_027e5710;
  breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
  Flow::Flow(__return_storage_ptr__,breakTo);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    // Traverse into functions using the same mode, which we can also do
    // when replacing as long as the function does not have any side effects.
    // Might yield something useful for simple functions like `clamp`, sometimes
    // even if arguments are only partially constant or not constant at all.
    if ((flags & FlagValues::TRAVERSE_CALLS) != 0 && this->module != nullptr) {
      auto* func = this->module->getFunction(curr->target);
      if (!func->imported()) {
        if (func->getResults().isConcrete()) {
          auto numOperands = curr->operands.size();
          assert(numOperands == func->getNumParams());
          auto prevLocalValues = localValues;
          localValues.clear();
          for (Index i = 0; i < numOperands; ++i) {
            auto argFlow = ExpressionRunner<SubType>::visit(curr->operands[i]);
            if (!argFlow.breaking()) {
              assert(argFlow.values.isConcrete());
              localValues[i] = argFlow.values;
            }
          }
          auto retFlow = ExpressionRunner<SubType>::visit(func->body);
          localValues = prevLocalValues;
          if (retFlow.breakTo == RETURN_FLOW) {
            return Flow(retFlow.values);
          } else if (!retFlow.breaking()) {
            return retFlow;
          }
        }
      }
    }
    return Flow(NONCONSTANT_FLOW);
  }